

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O3

void __thiscall cmCryptoHash::cmCryptoHash(cmCryptoHash *this,Algo algo)

{
  uint hash_id;
  rhash prVar1;
  
  hash_id = cmCryptoHashAlgoToId[algo];
  this->Id = hash_id;
  if (cmCryptoHash_rhash_library_initialized == '\0') {
    cmCryptoHash_rhash_library_initialized = '\x01';
    rhash_library_init();
  }
  prVar1 = rhash_init(hash_id);
  this->CTX = prVar1;
  return;
}

Assistant:

cmCryptoHash::cmCryptoHash(Algo algo)
  : Id(cmCryptoHashAlgoToId[algo])
  , CTX(cmCryptoHash_rhash_init(this->Id))
{
}